

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void setup_connection(FM_OPN *OPN,FM_CH *CH,int ch)

{
  INT32 *pIVar1;
  INT32 *pIVar2;
  
  pIVar1 = OPN->out_fm + (uint)ch;
  switch(CH->ALGO) {
  case '\0':
    CH->connect1 = &OPN->c1;
    break;
  case '\x01':
    CH->connect1 = &OPN->mem;
    break;
  case '\x02':
    CH->connect1 = &OPN->c2;
    CH->connect2 = &OPN->mem;
    goto LAB_001328f0;
  case '\x03':
    CH->connect1 = &OPN->c1;
    CH->connect2 = &OPN->mem;
    pIVar2 = &OPN->c2;
    CH->connect3 = pIVar2;
    goto LAB_0013293e;
  case '\x04':
    CH->connect1 = &OPN->c1;
    CH->connect2 = pIVar1;
    CH->connect3 = &OPN->c2;
    goto LAB_00132937;
  case '\x05':
    CH->connect1 = (INT32 *)0x0;
    CH->connect2 = pIVar1;
    CH->connect3 = pIVar1;
    goto LAB_00132912;
  case '\x06':
    CH->connect1 = &OPN->c1;
    goto LAB_00132929;
  case '\a':
    CH->connect1 = pIVar1;
LAB_00132929:
    CH->connect2 = pIVar1;
    CH->connect3 = pIVar1;
LAB_00132937:
    pIVar2 = &OPN->mem;
    goto LAB_0013293e;
  default:
    goto switchD_0013283d_default;
  }
  CH->connect2 = &OPN->mem;
LAB_001328f0:
  CH->connect3 = &OPN->c2;
LAB_00132912:
  pIVar2 = &OPN->m2;
LAB_0013293e:
  CH->mem_connect = pIVar2;
switchD_0013283d_default:
  CH->connect4 = pIVar1;
  return;
}

Assistant:

INLINE void setup_connection( FM_OPN *OPN, FM_CH *CH, int ch )
{
	INT32 *carrier = &OPN->out_fm[ch];

	INT32 **om1 = &CH->connect1;
	INT32 **om2 = &CH->connect3;
	INT32 **oc1 = &CH->connect2;

	INT32 **memc = &CH->mem_connect;

	switch( CH->ALGO )
	{
	case 0:
		/* M1---C1---MEM---M2---C2---OUT */
		*om1 = &OPN->c1;
		*oc1 = &OPN->mem;
		*om2 = &OPN->c2;
		*memc= &OPN->m2;
		break;
	case 1:
		/* M1------+-MEM---M2---C2---OUT */
		/*      C1-+                     */
		*om1 = &OPN->mem;
		*oc1 = &OPN->mem;
		*om2 = &OPN->c2;
		*memc= &OPN->m2;
		break;
	case 2:
		/* M1-----------------+-C2---OUT */
		/*      C1---MEM---M2-+          */
		*om1 = &OPN->c2;
		*oc1 = &OPN->mem;
		*om2 = &OPN->c2;
		*memc= &OPN->m2;
		break;
	case 3:
		/* M1---C1---MEM------+-C2---OUT */
		/*                 M2-+          */
		*om1 = &OPN->c1;
		*oc1 = &OPN->mem;
		*om2 = &OPN->c2;
		*memc= &OPN->c2;
		break;
	case 4:
		/* M1---C1-+-OUT */
		/* M2---C2-+     */
		/* MEM: not used */
		*om1 = &OPN->c1;
		*oc1 = carrier;
		*om2 = &OPN->c2;
		*memc= &OPN->mem;   /* store it anywhere where it will not be used */
		break;
	case 5:
		/*    +----C1----+     */
		/* M1-+-MEM---M2-+-OUT */
		/*    +----C2----+     */
		*om1 = NULL;    /* special mark */
		*oc1 = carrier;
		*om2 = carrier;
		*memc= &OPN->m2;
		break;
	case 6:
		/* M1---C1-+     */
		/*      M2-+-OUT */
		/*      C2-+     */
		/* MEM: not used */
		*om1 = &OPN->c1;
		*oc1 = carrier;
		*om2 = carrier;
		*memc= &OPN->mem;   /* store it anywhere where it will not be used */
		break;
	case 7:
		/* M1-+     */
		/* C1-+-OUT */
		/* M2-+     */
		/* C2-+     */
		/* MEM: not used*/
		*om1 = carrier;
		*oc1 = carrier;
		*om2 = carrier;
		*memc= &OPN->mem;   /* store it anywhere where it will not be used */
		break;
	}

	CH->connect4 = carrier;
}